

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Value *test_value)

{
  bool bVar1;
  Am_ID_Tag AVar2;
  uint uVar3;
  bool local_29;
  bool local_19;
  Am_Value *test_value_local;
  Am_Value *this_local;
  
  local_19 = true;
  if (this->type == test_value->type) {
    AVar2 = Am_Type_Class(this->type);
    local_19 = true;
    if (AVar2 != 0x1000) {
      bVar1 = Am_Type_Is_Ref_Counted(this->type);
      if ((bVar1) && ((this->value).wrapper_value != (test_value->value).wrapper_value)) {
        if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
          return true;
        }
        if ((test_value->value).wrapper_value == (Am_Wrapper *)0x0) {
          return true;
        }
        uVar3 = (*(((this->value).wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type
                  [6])((this->value).wrapper_value,(test_value->value).wrapper_value);
        if ((uVar3 & 1) == 0) {
          return true;
        }
      }
      bVar1 = Am_Type_Is_Ref_Counted(this->type);
      local_29 = false;
      if (!bVar1) {
        local_29 = (this->value).wrapper_value != (test_value->value).wrapper_value;
      }
      local_19 = local_29;
    }
  }
  return local_19;
}

Assistant:

bool
Am_Value::operator!=(const Am_Value &test_value) const
{
  return type != test_value.type ||
         Am_Type_Class(type) == Am_ERROR_VALUE_TYPE ||
         (Am_Type_Is_Ref_Counted(type) &&
          value.wrapper_value != test_value.value.wrapper_value &&
          (!value.wrapper_value || !test_value.value.wrapper_value ||
           !(*value.wrapper_value == *test_value.value.wrapper_value))) ||
         (!Am_Type_Is_Ref_Counted(type) &&
          value.voidptr_value != test_value.value.voidptr_value);
}